

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

void __thiscall deqp::egl::ResizeTest::deinit(ResizeTest *this)

{
  Library *pLVar1;
  ResizeTest *this_local;
  
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar1->_vptr_Library[0x34])(pLVar1,this->m_display);
  }
  this->m_config = (EGLConfig)0x0;
  this->m_display = (EGLDisplay)0x0;
  de::details::MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::clear
            (&this->m_context);
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::clear
            (&this->m_surface);
  de::details::MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::clear
            (&this->m_nativeWindow);
  return;
}

Assistant:

void ResizeTest::deinit (void)
{
	if (m_display != EGL_NO_DISPLAY)
		m_eglTestCtx.getLibrary().terminate(m_display);

	m_config		= DE_NULL;
	m_display		= EGL_NO_DISPLAY;
	m_context.clear();
	m_surface.clear();
	m_nativeWindow.clear();
}